

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

void tunnel_stream_clear(tunnel_stream *ts)

{
  tunnel_stream *ts_local;
  
  Curl_http_resp_free(ts->resp);
  Curl_bufq_free(&ts->recvbuf);
  Curl_bufq_free(&ts->sendbuf);
  (*Curl_cfree)(ts->authority);
  ts->authority = (char *)0x0;
  memset(ts,0,0xa8);
  ts->state = H2_TUNNEL_INIT;
  return;
}

Assistant:

static void tunnel_stream_clear(struct tunnel_stream *ts)
{
  Curl_http_resp_free(ts->resp);
  Curl_bufq_free(&ts->recvbuf);
  Curl_bufq_free(&ts->sendbuf);
  Curl_safefree(ts->authority);
  memset(ts, 0, sizeof(*ts));
  ts->state = H2_TUNNEL_INIT;
}